

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.hpp
# Opt level: O3

double duckdb::alp::AlpRDCompression<float,_true>::BuildLeftPartsDictionary<false>
                 (vector<unsigned_int,_true> *values,uint8_t right_bit_width,State *state)

{
  uint *puVar1;
  pointer puVar2;
  pointer puVar3;
  double dVar4;
  double dVar5;
  pointer pAVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  pointer pAVar9;
  reference pvVar10;
  ulong uVar11;
  uint uVar12;
  __node_base _Var13;
  uint *value;
  uint *puVar14;
  vector<unsigned_int,_true> *__range3;
  long lVar15;
  long lVar16;
  size_type __n;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined1 auVar19 [16];
  vector<duckdb::alp::AlpRDLeftPartInfo,_true> left_parts_sorted_repetitions;
  uint left_tmp;
  unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  left_parts_hash;
  vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_> local_98;
  uint local_74;
  double local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_98.
  super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar14 = (values->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar1 = (values->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar14 != puVar1) {
    do {
      local_74 = *puVar14 >> (right_bit_width & 0x1f);
      pmVar7 = ::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,&local_74);
      *pmVar7 = *pmVar7 + 1;
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar1);
  }
  ::std::vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>::
  reserve(&local_98,local_68._M_element_count);
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var13._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      ::std::vector<duckdb::alp::AlpRDLeftPartInfo,std::allocator<duckdb::alp::AlpRDLeftPartInfo>>::
      emplace_back<int&,unsigned_int_const&>
                ((vector<duckdb::alp::AlpRDLeftPartInfo,std::allocator<duckdb::alp::AlpRDLeftPartInfo>>
                  *)&local_98,(int *)((long)&_Var13._M_nxt[1]._M_nxt + 4),
                 (uint *)(_Var13._M_nxt + 1));
      _Var13._M_nxt = (_Var13._M_nxt)->_M_nxt;
    } while (_Var13._M_nxt != (_Hash_node_base *)0x0);
  }
  pAVar6 = local_98.
           super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar9 = local_98.
           super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_98.
      super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar8 = (long)local_98.
                  super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_98.
                  super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar15 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::alp::AlpRDLeftPartInfo*,std::vector<duckdb::alp::AlpRDLeftPartInfo,std::allocator<duckdb::alp::AlpRDLeftPartInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::alp::AlpRDCompression<float,true>::BuildLeftPartsDictionary<false>(duckdb::vector<unsigned_int,true>const&,unsigned_char,duckdb::alp::AlpRDCompressionState<float,true>&)::_lambda(duckdb::alp::AlpRDLeftPartInfo_const&,duckdb::alp::AlpRDLeftPartInfo_const&)_1_>>
              (local_98.
               super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_98.
               super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<duckdb::alp::AlpRDLeftPartInfo*,std::vector<duckdb::alp::AlpRDLeftPartInfo,std::allocator<duckdb::alp::AlpRDLeftPartInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::alp::AlpRDCompression<float,true>::BuildLeftPartsDictionary<false>(duckdb::vector<unsigned_int,true>const&,unsigned_char,duckdb::alp::AlpRDCompressionState<float,true>&)::_lambda(duckdb::alp::AlpRDLeftPartInfo_const&,duckdb::alp::AlpRDLeftPartInfo_const&)_1_>>
              (pAVar9,pAVar6);
    pAVar9 = local_98.
             super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  uVar8 = (long)pAVar9 -
          (long)local_98.
                super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  dVar4 = 0.0;
  if (8 < uVar8) {
    __n = 8;
    uVar12 = 0;
    do {
      pvVar10 = vector<duckdb::alp::AlpRDLeftPartInfo,_true>::operator[]
                          ((vector<duckdb::alp::AlpRDLeftPartInfo,_true> *)&local_98,__n);
      uVar12 = uVar12 + pvVar10->count;
      __n = __n + 1;
      uVar8 = (long)local_98.
                    super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_98.
                    super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
    } while (__n < uVar8);
    dVar4 = (double)((uVar12 & 0xffff) << 5);
  }
  uVar11 = 8;
  if (uVar8 < 8) {
    uVar11 = uVar8;
  }
  dVar5 = log2((double)(long)uVar11);
  uVar17 = SUB84(dVar5,0);
  uVar18 = (undefined4)((ulong)dVar5 >> 0x20);
  puVar2 = (values->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (values->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    local_70 = dVar5;
    operator_delete(local_98.
                    super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    uVar17 = SUB84(local_70,0);
    uVar18 = (undefined4)((ulong)local_70 >> 0x20);
  }
  lVar15 = (long)puVar3 - (long)puVar2;
  lVar16 = lVar15 >> 2;
  auVar19._8_4_ = (int)(lVar15 >> 0x22);
  auVar19._0_8_ = lVar16;
  auVar19._12_4_ = 0x45300000;
  dVar5 = ceil((double)CONCAT44(uVar18,uVar17));
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return (double)((uint)right_bit_width + ((int)dVar5 + (uint)((char)(int)dVar5 == '\0') & 0xff)) +
         dVar4 / ((auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0));
}

Assistant:

static double BuildLeftPartsDictionary(const vector<EXACT_TYPE> &values, uint8_t right_bit_width, State &state) {
		unordered_map<EXACT_TYPE, int32_t> left_parts_hash;
		vector<AlpRDLeftPartInfo> left_parts_sorted_repetitions;

		// Building a hash for all the left parts and how many times they appear
		for (auto &value : values) {
			auto left_tmp = value >> right_bit_width;
			left_parts_hash[left_tmp]++;
		}

		// We build a vector from the hash to be able to sort it by repetition count
		left_parts_sorted_repetitions.reserve(left_parts_hash.size());
		for (auto &hash_pair : left_parts_hash) {
			left_parts_sorted_repetitions.emplace_back(hash_pair.second, hash_pair.first);
		}
		sort(left_parts_sorted_repetitions.begin(), left_parts_sorted_repetitions.end(),
		     [](const AlpRDLeftPartInfo &a, const AlpRDLeftPartInfo &b) { return a.count > b.count; });

		// Exceptions are left parts which do not fit in the fixed dictionary size
		uint32_t exceptions_count = 0;
		for (idx_t i = AlpRDConstants::MAX_DICTIONARY_SIZE; i < left_parts_sorted_repetitions.size(); i++) {
			exceptions_count += left_parts_sorted_repetitions[i].count;
		}

		// The left parts bit width after compression is determined by how many elements are in the dictionary
		uint64_t actual_dictionary_size =
		    MinValue<uint64_t>(AlpRDConstants::MAX_DICTIONARY_SIZE, left_parts_sorted_repetitions.size());
		uint8_t left_bit_width =
		    MaxValue<uint8_t>(1, ExactNumericCast<uint8_t>(std::ceil(std::log2(actual_dictionary_size))));

		if (PERSIST_DICT) {
			for (idx_t dict_idx = 0; dict_idx < actual_dictionary_size; dict_idx++) {
				//! The dict keys are mapped to the left part themselves
				state.left_parts_dict[dict_idx] =
				    UnsafeNumericCast<uint16_t>(left_parts_sorted_repetitions[dict_idx].hash);
				state.left_parts_dict_map.insert({state.left_parts_dict[dict_idx], dict_idx});
			}
			//! Pararelly we store a map of the dictionary to quickly resolve exceptions during encoding
			for (idx_t i = actual_dictionary_size + 1; i < left_parts_sorted_repetitions.size(); i++) {
				state.left_parts_dict_map.insert({left_parts_sorted_repetitions[i].hash, i});
			}
			state.left_bit_width = left_bit_width;
			state.right_bit_width = right_bit_width;
			state.actual_dictionary_size = UnsafeNumericCast<uint8_t>(actual_dictionary_size);

			D_ASSERT(state.left_bit_width > 0 && state.right_bit_width > 0 &&
			         state.left_bit_width <= AlpRDConstants::MAX_DICTIONARY_BIT_WIDTH &&
			         state.actual_dictionary_size <= AlpRDConstants::MAX_DICTIONARY_SIZE);
		}

		double estimated_size = EstimateCompressionSize(right_bit_width, left_bit_width,
		                                                UnsafeNumericCast<uint16_t>(exceptions_count), values.size());
		return estimated_size;
	}